

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intmul_k(jit_State *J)

{
  jit_State *J_local;
  
  if ((J->fold).right[0].field_1.op12 == 0) {
    J_local._4_4_ = (uint)(J->fold).ins.field_0.op2;
  }
  else if ((J->fold).right[0].field_1.op12 == 1) {
    J_local._4_4_ = (uint)(J->fold).ins.field_0.op1;
  }
  else if ((J->fold).right[0].field_1.op12 == 2) {
    (J->fold).ins.field_1.o = '5';
    (J->fold).ins.field_0.op2 = (J->fold).ins.field_0.op1;
    J_local._4_4_ = 1;
  }
  else {
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(MULOV any KINT)
LJFOLDF(simplify_intmul_k)
{
  if (fright->i == 0)  /* i * 0 ==> 0 */
    return RIGHTFOLD;
  if (fright->i == 1)  /* i * 1 ==> i */
    return LEFTFOLD;
  if (fright->i == 2) {  /* i * 2 ==> i + i */
    fins->o = IR_ADDOV;
    fins->op2 = fins->op1;
    return RETRYFOLD;
  }
  return NEXTFOLD;
}